

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

bool __thiscall Minisat::Solver::SATchecker::checkModel(SATchecker *this,vec<Minisat::lbool> *model)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  uchar *tbs;
  size_t *siglen;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *siglen_00;
  vec<Minisat::lbool> *in_RSI;
  uchar *sig;
  vec<Minisat::Lit> *in_RDI;
  size_t in_R8;
  Var v;
  int j;
  Lit *l;
  int i;
  vec<Minisat::Lit> d;
  int last_litUndef;
  bool satisfied_current_clause;
  bool valid;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  vec<Minisat::Lit> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  ostream *in_stack_ffffffffffffff50;
  bool local_a1;
  lbool local_65;
  uint local_64;
  lbool local_5d;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined4 local_4c;
  Lit *local_48;
  int local_2c;
  vec<Minisat::Lit> local_28;
  int local_18;
  bool local_12;
  byte local_11;
  vec<Minisat::lbool> *local_10;
  
  local_11 = 1;
  local_12 = false;
  local_18 = -1;
  local_10 = in_RSI;
  vec<Minisat::Lit>::vec(&local_28);
  local_2c = 0;
  do {
    iVar3 = local_2c;
    uVar2 = vec<Minisat::Lit>::size(in_RDI);
    tbs = (uchar *)(ulong)uVar2;
    if ((int)uVar2 <= iVar3) goto LAB_0014687b;
    local_48 = vec<Minisat::Lit>::operator[](in_RDI,local_2c);
    local_4c = 0xfffffffe;
    sig = (uchar *)0xfffffffe;
    bVar1 = Lit::operator==(local_48,(Lit)0xfffffffe);
    if (bVar1) {
      if ((local_12 & 1U) == 0) {
        local_11 = 0;
        vec<Minisat::Lit>::clear(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
        local_50 = local_18;
        while (local_50 = local_50 + 1, local_50 < local_2c) {
          vec<Minisat::Lit>::operator[](in_RDI,local_50);
          vec<Minisat::Lit>::push
                    (in_stack_ffffffffffffff40,
                     (Lit *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        }
        std::operator<<((ostream *)&std::cout,"c clause ");
        poVar4 = operator<<(in_stack_ffffffffffffff50,
                            (vec<Minisat::Lit> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        poVar4 = std::operator<<(poVar4," is not satisfied by the model");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
LAB_0014687b:
        vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x146893);
        return (bool)(local_11 & 1);
      }
      local_12 = false;
      local_18 = local_2c;
    }
    else {
      local_58 = local_48->x;
      local_54 = var((Lit)local_58);
      iVar3 = vec<Minisat::lbool>::size(local_10);
      if (local_54 <= iVar3) {
        local_a1 = true;
        if ((local_12 & 1U) == 0) {
          local_5c = local_48->x;
          uVar2 = sign((EVP_PKEY_CTX *)(ulong)local_5c,sig,siglen,tbs,in_R8);
          siglen_00 = extraout_RDX;
          if ((uVar2 & 1) != 0) {
            in_stack_ffffffffffffff50 =
                 (ostream *)vec<Minisat::lbool>::operator[](local_10,local_54);
            lbool::lbool(&local_5d,'\x01');
            sig = (uchar *)(ulong)local_5d.value;
            bVar1 = lbool::operator==((lbool *)in_stack_ffffffffffffff50,local_5d);
            tbs = (uchar *)CONCAT71((int7)((ulong)tbs >> 8),bVar1);
            local_a1 = true;
            siglen_00 = extraout_RDX_00;
            if (bVar1) goto LAB_00146856;
          }
          local_64 = local_48->x;
          uVar2 = sign((EVP_PKEY_CTX *)(ulong)local_64,sig,siglen_00,tbs,in_R8);
          in_stack_ffffffffffffff4f = false;
          local_a1 = (bool)in_stack_ffffffffffffff4f;
          if ((uVar2 & 1) == 0) {
            in_stack_ffffffffffffff40 =
                 (vec<Minisat::Lit> *)vec<Minisat::lbool>::operator[](local_10,local_54);
            lbool::lbool(&local_65,'\x01');
            in_stack_ffffffffffffff4f =
                 lbool::operator!=((lbool *)CONCAT17(in_stack_ffffffffffffff3f,
                                                     in_stack_ffffffffffffff38),
                                   (lbool)(uint8_t)((ulong)in_stack_ffffffffffffff40 >> 0x38));
            local_a1 = (bool)in_stack_ffffffffffffff4f;
          }
        }
LAB_00146856:
        local_12 = local_a1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool checkModel(const vec<lbool> &model)
        {
            bool valid = true;
            bool satisfied_current_clause = false;
            int last_litUndef = -1;
            vec<Lit> d;
            for (int i = 0; i < check_formula.size(); ++i) {
                const Lit &l = check_formula[i];

                // handle end of clause, abort if last clause was not satisfied
                if (l == lit_Undef) {
                    if (!satisfied_current_clause) {
                        valid = false;
                        d.clear();
                        for (int j = last_litUndef + 1; j < i; ++j) d.push(check_formula[j]);
                        std::cout << "c clause " << d << " is not satisfied by the model" << std::endl;
                        break;
                    }
                    satisfied_current_clause = false; // start fresh for next clause
                    last_litUndef = i;
                } else {
                    Var v = var(l);
                    if (model.size() < v) continue; // this variable is not covered by the model

                    // either clause is already satisfied, or this literal is satisfied
                    satisfied_current_clause =
                    satisfied_current_clause || (sign(l) && model[v] == l_False) || (!sign(l) && (model[v] != l_False));
                }
            }
            assert(valid && "the current clause should have been satisfied by the model");
            return valid;
        }